

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int FE_New_Line(FORM *form)

{
  FIELD *field_00;
  _Bool _Var1;
  char *buf;
  char *pcVar2;
  bool bVar3;
  _Bool local_33;
  _Bool May_Do_It;
  _Bool Last_Row;
  char *t;
  char *bp;
  FIELD *field;
  FORM *form_local;
  
  field_00 = form->current;
  bVar3 = field_00->drows + -1 == form->currow;
  if ((form->status & 4) == 0) {
    if ((bVar3) && (((field_00->status & 8) == 0 || ((int)field_00->rows + field_00->nrow == 1)))) {
      if ((form->opts & 1U) == 0) {
        form_local._4_4_ = -0xc;
      }
      else {
        form_local._4_4_ = Inter_Field_Navigation(FN_Next_Field,form);
      }
    }
    else {
      local_33 = false;
      if (!bVar3) {
        local_33 = Is_There_Room_For_A_Line(form);
      }
      if ((local_33 == false) && ((field_00->status & 8) == 0)) {
        form_local._4_4_ = -0xc;
      }
      else {
        if ((local_33 == false) && (_Var1 = Field_Grown(field_00,1), !_Var1)) {
          return -1;
        }
        buf = form->current->buf + (long)form->curcol + (long)(form->currow * form->current->dcols);
        pcVar2 = After_End_Of_Data(buf,field_00->dcols - form->curcol);
        wclrtoeol(form->w);
        form->currow = form->currow + 1;
        form->curcol = 0;
        wmove(form->w,form->currow,form->curcol);
        winsdelln(form->w,1);
        waddnstr(form->w,buf,(int)pcVar2 - (int)buf);
        form->status = form->status | 0x10;
        form_local._4_4_ = 0;
      }
    }
  }
  else if ((bVar3) && (((field_00->status & 8) == 0 || ((int)field_00->rows + field_00->nrow == 1)))
          ) {
    if ((form->opts & 1U) == 0) {
      form_local._4_4_ = -0xc;
    }
    else {
      wclrtoeol(form->w);
      form->status = form->status | 0x10;
      form_local._4_4_ = Inter_Field_Navigation(FN_Next_Field,form);
    }
  }
  else {
    if ((bVar3) && (_Var1 = Field_Grown(field_00,1), !_Var1)) {
      return -1;
    }
    wclrtoeol(form->w);
    form->currow = form->currow + 1;
    form->curcol = 0;
    form->status = form->status | 0x10;
    form_local._4_4_ = 0;
  }
  return form_local._4_4_;
}

Assistant:

static int FE_New_Line(FORM * form)
{
  FIELD  *field = form->current;
  char *bp, *t;
  bool Last_Row = ((field->drows - 1)==form->currow);
  
  if (form->status & _OVLMODE) 
    {
      if (Last_Row && 
          (!(Growable(field) && !Single_Line_Field(field))))
        {
          if (!(form->opts & O_NL_OVERLOAD))
            return(E_REQUEST_DENIED);
          wclrtoeol(form->w);
          /* we have to set this here, although it is also
             handled in the generic routine. The reason is,
             that FN_Next_Field may fail, but the form is
             definitively changed */
          form->status |= _WINDOW_MODIFIED;
          return Inter_Field_Navigation(FN_Next_Field,form);
        }
      else 
        {
          if (Last_Row && !Field_Grown(field,1))
            { /* N.B.: due to the logic in the 'if', LastRow==TRUE
                 means here that the field is growable and not
                 a single-line field */
              return(E_SYSTEM_ERROR);
            }
          wclrtoeol(form->w);
          form->currow++;
          form->curcol = 0;
          form->status |= _WINDOW_MODIFIED;
          return(E_OK);
        }
    }
  else 
    { /* Insert Mode */
      if (Last_Row &&
          !(Growable(field) && !Single_Line_Field(field)))
        {
          if (!(form->opts & O_NL_OVERLOAD))
            return(E_REQUEST_DENIED);
          return Inter_Field_Navigation(FN_Next_Field,form);
        }
      else 
        {
          bool May_Do_It = !Last_Row && Is_There_Room_For_A_Line(form);
          
          if (!(May_Do_It || Growable(field)))
            return(E_REQUEST_DENIED);
          if (!May_Do_It && !Field_Grown(field,1))
            return(E_SYSTEM_ERROR);
          
          bp= Address_Of_Current_Position_In_Buffer(form);
          t = After_End_Of_Data(bp,field->dcols - form->curcol);
          wclrtoeol(form->w);
          form->currow++;
          form->curcol=0;
          wmove(form->w,form->currow,form->curcol);
          winsertln(form->w);
          waddnstr(form->w,bp,(int)(t-bp));
          form->status |= _WINDOW_MODIFIED;
          return E_OK;
        }
    }
}